

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFLogger.cc
# Opt level: O3

shared_ptr<Pipeline> __thiscall QPDFLogger::getInfo(QPDFLogger *this,bool null_okay)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined7 in_register_00000031;
  shared_ptr<Pipeline> sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             (*(long *)CONCAT71(in_register_00000031,null_okay) + 0x48);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  sVar2 = throwIfNull(this,(shared_ptr<Pipeline> *)CONCAT71(in_register_00000031,null_okay),true);
  _Var1 = sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Pipeline>)sVar2.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Pipeline>
QPDFLogger::getInfo(bool null_okay)
{
    return throwIfNull(m->p_info, null_okay);
}